

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O1

int __thiscall
wabt::string_view::compare(string_view *this,size_type pos1,size_type n1,string_view s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = s.size_;
  uVar3 = this->size_ - pos1;
  if (pos1 <= this->size_) {
    if (uVar3 < n1) {
      n1 = uVar3;
    }
    uVar3 = uVar4;
    if (n1 < uVar4) {
      uVar3 = n1;
    }
    uVar2 = 0;
    if (uVar3 != 0) {
      uVar2 = memcmp(this->data_ + pos1,s.data_,uVar3);
    }
    uVar1 = -(uint)(n1 < uVar4) | 1;
    if (uVar2 != 0) {
      uVar1 = uVar2;
    }
    if (n1 == uVar4) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  __assert_fail("pos <= size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/string-view.cc"
                ,0x3e,"string_view wabt::string_view::substr(size_type, size_type) const");
}

Assistant:

string_view string_view::substr(size_type pos, size_type n) const {
  assert(pos <= size_);
  size_t count = std::min(n, size_ - pos);
  return string_view(data_ + pos, count);
}